

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluation_method.cpp
# Opt level: O0

void MPIX_Internode_cost_stencil
               (MPI_Comm cart_comm,int *total,int *max,int *stencil,int n_neighbors)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  int num_neighbors;
  int *stencil_00;
  int *cart_comm_00;
  int *piVar4;
  ulong uVar5;
  long alStack_90 [3];
  int aiStack_78 [2];
  int *local_70;
  int *local_68;
  ulong local_60;
  unsigned_long __vla_expr2;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  uint local_3c;
  MPI_Comm poStack_38;
  int ndims;
  MPI_Comm dist_graph;
  int status;
  int n_neighbors_local;
  int *stencil_local;
  int *max_local;
  int *total_local;
  MPI_Comm cart_comm_local;
  
  alStack_90[2] = 0x27ce09;
  dist_graph._4_4_ = n_neighbors;
  _status = stencil;
  stencil_local = max;
  max_local = total;
  total_local = (int *)cart_comm;
  MPI_Topo_test(cart_comm,&dist_graph);
  if ((int)dist_graph == 1) {
    alStack_90[2] = 0x27ce3d;
    MPI_Cartdim_get(total_local,&local_3c);
    piVar1 = total_local;
    uVar3 = local_3c;
    __vla_expr1 = (unsigned_long)local_3c;
    local_70 = (int *)((long)aiStack_78 - (__vla_expr1 * 4 + 0xf & 0xfffffffffffffff0));
    __vla_expr2 = (unsigned_long)local_3c;
    piVar4 = (int *)((long)local_70 - (__vla_expr2 * 4 + 0xf & 0xfffffffffffffff0));
    local_60 = (ulong)local_3c;
    uVar5 = local_60 * 4 + 0xf & 0xfffffffffffffff0;
    local_68 = piVar4;
    __vla_expr0 = (unsigned_long)aiStack_78;
    *(undefined8 *)((long)piVar4 + (-8 - uVar5)) = 0x27ceac;
    MPI_Cart_get(piVar1,uVar3);
    cart_comm_00 = total_local;
    stencil_00 = _status;
    num_neighbors = dist_graph._4_4_;
    piVar2 = local_68;
    piVar1 = local_70;
    *(MPI_Comm **)((long)piVar4 + (-0x10 - uVar5)) = &stack0xffffffffffffffc8;
    *(undefined8 *)((long)piVar4 + (-0x18 - uVar5)) = 0x27ced3;
    mpireorderinglib::MPIX_Dist_graph_create_from_cart_comm
              ((MPI_Comm)cart_comm_00,local_3c,stencil_00,num_neighbors,piVar1,piVar2,
               *(MPI_Comm **)((long)piVar4 + (-0x10 - uVar5)));
    piVar2 = max_local;
    piVar1 = stencil_local;
    *(undefined8 *)((long)piVar4 + (-8 - uVar5)) = 0x27cee8;
    mpireorderinglib::MPIX_Dist_graph_internode_cost(poStack_38,piVar2,piVar1);
    *(undefined8 *)((long)piVar4 + (-8 - uVar5)) = 0x27cef1;
    MPI_Comm_free(&stack0xffffffffffffffc8);
    return;
  }
  alStack_90[2] = 0x27ce30;
  __assert_fail("status == MPI_CART",
                "/workspace/llm4binary/github/license_all_cmakelists_25/viennamapping[P]mpicartreorderlib/src/Evaluation/evaluation_method.cpp"
                ,0xd9,"void MPIX_Internode_cost_stencil(MPI_Comm, int *, int *, int *, int)");
}

Assistant:

void MPIX_Internode_cost_stencil(MPI_Comm cart_comm, int *total, int *max, int stencil[], int n_neighbors) {
  int status;
  MPI_Topo_test(cart_comm, &status);
  assert(status == MPI_CART);
  MPI_Comm dist_graph;
  int ndims;
  MPI_Cartdim_get(cart_comm, &ndims);
  int dims[ndims], periods[ndims], coords[ndims];
  MPI_Cart_get(cart_comm, ndims, dims, periods, coords);
  mpireorderinglib::MPIX_Dist_graph_create_from_cart_comm(cart_comm,
														  ndims,
														  stencil,
														  n_neighbors,
														  dims,
														  periods,
														  &dist_graph);
  mpireorderinglib::MPIX_Dist_graph_internode_cost(dist_graph, total, max);
  MPI_Comm_free(&dist_graph);
}